

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

optional<pbrt::Point2<float>_> __thiscall
pbrt::PiecewiseConstant2D::Invert(PiecewiseConstant2D *this,Point2f *p)

{
  float fVar1;
  undefined1 auVar2 [16];
  float *pfVar3;
  undefined4 in_EDX;
  undefined4 extraout_EDX;
  undefined4 in_register_00000014;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 in_XMM3 [16];
  optional<pbrt::Point2<float>_> oVar7;
  optional<float> cInv;
  optional<float> mInv;
  undefined1 auStack_38 [8];
  undefined1 local_30 [8];
  
  PiecewiseConstant1D::Invert
            ((PiecewiseConstant1D *)local_30,*(Float *)(CONCAT44(in_register_00000014,in_EDX) + 4));
  if (((local_30[4] == false) ||
      (fVar4 = (p->super_Tuple2<pbrt::Point2,_float>).y,
      fVar4 = (((Float *)CONCAT44(in_register_00000014,in_EDX))[1] - fVar4) /
              (p[1].super_Tuple2<pbrt::Point2,_float>.y - fVar4), fVar4 < 0.0)) || (1.0 < fVar4)) {
    (this->domain).pMax.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
    (this->domain).pMin.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)0x0;
  }
  else {
    auVar6._0_12_ = ZEXT812(0);
    auVar6._12_4_ = 0;
    auVar5 = vcvtusi2ss_avx512f(in_XMM3,p[5].super_Tuple2<pbrt::Point2,_float>);
    auVar2 = vcvtusi2ss_avx512f(in_XMM3,(long)p[5].super_Tuple2<pbrt::Point2,_float> + -1);
    auVar5 = ZEXT416((uint)(fVar4 * auVar5._0_4_));
    vcmpss_avx512f(auVar5,auVar6,1);
    vminss_avx(auVar2,auVar5);
    PiecewiseConstant1D::Invert
              ((PiecewiseConstant1D *)auStack_38,*(Float *)CONCAT44(in_register_00000014,in_EDX));
    if (auStack_38[4] == false) {
      (this->domain).pMax.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
      (this->domain).pMin.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)0x0;
    }
    else {
      pfVar3 = pstd::optional<float>::value((optional<float> *)auStack_38);
      fVar4 = *pfVar3;
      pfVar3 = pstd::optional<float>::value((optional<float> *)local_30);
      fVar1 = *pfVar3;
      *(undefined1 *)&(this->domain).pMax.super_Tuple2<pbrt::Point2,_float>.x = 1;
      (this->domain).pMin.super_Tuple2<pbrt::Point2,_float>.x = fVar4;
      (this->domain).pMin.super_Tuple2<pbrt::Point2,_float>.y = fVar1;
    }
    pstd::optional<float>::~optional((optional<float> *)auStack_38);
  }
  pstd::optional<float>::~optional((optional<float> *)local_30);
  oVar7._8_4_ = extraout_EDX;
  oVar7.optionalValue =
       (aligned_storage_t<sizeof(pbrt::Point2<float>),_alignof(pbrt::Point2<float>)>)this;
  return oVar7;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<Point2f> Invert(const Point2f &p) const {
        pstd::optional<Float> mInv = pMarginal.Invert(p[1]);
        if (!mInv)
            return {};
        Float p1o = (p[1] - domain.pMin[1]) / (domain.pMax[1] - domain.pMin[1]);
        if (p1o < 0 || p1o > 1)
            return {};
        int offset = Clamp(p1o * pConditionalV.size(), 0, pConditionalV.size() - 1);
        pstd::optional<Float> cInv = pConditionalV[offset].Invert(p[0]);
        if (!cInv)
            return {};
        return Point2f(*cInv, *mInv);
    }